

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

shared_ptr<Scene> __thiscall
Scene::Create(Scene *this,shared_ptr<myvk::Queue> *graphics_queue,char *filename,
             atomic<const_char_*> *notification_ptr)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Scene> sVar6;
  shared_ptr<Scene> ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texture_filenames;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> meshes;
  char *filename_local;
  undefined1 local_50 [16];
  string base_dir;
  
  filename_local = filename;
  std::make_shared<Scene>();
  sVar4 = strlen(filename);
  if (sVar4 == 0) {
    base_dir._M_dataplus._M_p = (pointer)&base_dir.field_2;
    base_dir._M_string_length = 0;
    base_dir.field_2._M_local_buf[0] = '\0';
  }
  else {
    pcVar5 = filename + sVar4;
    do {
      if ((pcVar5[-1] == '/') || (pcVar5[-1] == '\\')) break;
      bVar2 = filename < pcVar5;
      pcVar5 = pcVar5 + -1;
    } while (bVar2);
    base_dir._M_dataplus._M_p = (pointer)&base_dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&base_dir,filename);
  }
  meshes.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  meshes.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  meshes.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture_filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texture_filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (notification_ptr != (atomic<const_char_*> *)0x0) {
    LOCK();
    (notification_ptr->_M_b)._M_p = "Loading Mesh";
    UNLOCK();
  }
  bVar2 = load_meshes(filename,base_dir._M_dataplus._M_p,&meshes,&texture_filenames);
  if (bVar2) {
    spdlog::info<char[22],char_const*&>((char (*) [22])"Meshes loaded from {}",&filename_local);
    if (notification_ptr != (atomic<const_char_*> *)0x0) {
      LOCK();
      (notification_ptr->_M_b)._M_p = "Optimizing Mesh and Creating Buffers";
      UNLOCK();
    }
    load_buffers_and_draw_cmd
              (ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr,graphics_queue,
               &meshes);
    if (notification_ptr != (atomic<const_char_*> *)0x0) {
      LOCK();
      (notification_ptr->_M_b)._M_p = "Loading Textures";
      UNLOCK();
    }
    iVar3 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    myvk::Sampler::Create
              ((Sampler *)local_50,(Ptr<Device> *)CONCAT44(extraout_var,iVar3),VK_FILTER_LINEAR,
               VK_SAMPLER_ADDRESS_MODE_REPEAT,VK_SAMPLER_MIPMAP_MODE_LINEAR,1000.0,false,1.0);
    std::__shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2> *)
               ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (__shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    load_textures(ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr,graphics_queue,
                  &texture_filenames);
    process_texture_errors(ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    this_00 = ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    create_descriptors(this_00,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_00,iVar3));
    _Var1 = ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var1._M_pi;
    ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    spdlog::error<char[22]>((char (*) [22])"Failed to load meshes");
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&texture_filenames);
  std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::~vector(&meshes);
  std::__cxx11::string::~string((string *)&base_dir);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar6.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar6.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Scene>)sVar6.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Scene> Scene::Create(const std::shared_ptr<myvk::Queue> &graphics_queue, const char *filename,
                                     std::atomic<const char *> *notification_ptr) {
	std::shared_ptr<Scene> ret = std::make_shared<Scene>();

	std::string base_dir = get_base_dir(filename);

	std::vector<Mesh> meshes;
	std::vector<std::string> texture_filenames;

	if (notification_ptr)
		notification_ptr->store("Loading Mesh");
	if (!load_meshes(filename, base_dir.c_str(), &meshes, &texture_filenames)) {
		spdlog::error("Failed to load meshes");
		return nullptr;
	}
	spdlog::info("Meshes loaded from {}", filename);

	if (notification_ptr)
		notification_ptr->store("Optimizing Mesh and Creating Buffers");
	ret->load_buffers_and_draw_cmd(graphics_queue, meshes);
	if (notification_ptr)
		notification_ptr->store("Loading Textures");
	ret->m_sampler =
	    myvk::Sampler::Create(graphics_queue->GetDevicePtr(), VK_FILTER_LINEAR, VK_SAMPLER_ADDRESS_MODE_REPEAT,
	                          VK_SAMPLER_MIPMAP_MODE_LINEAR, VK_LOD_CLAMP_NONE);
	ret->load_textures(graphics_queue, texture_filenames);
	ret->process_texture_errors();
	ret->create_descriptors(graphics_queue->GetDevicePtr());

	return ret;
}